

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O1

int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *p,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = (ulong)pNode1 & 0xfffffffffffffffe;
  uVar2 = (ulong)pNode2 & 0xfffffffffffffffe;
  if (uVar5 == uVar2) {
    __assert_fail("pNode1 != pNode2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigMan.c"
                  ,0x1cf,
                  "int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                 );
  }
  uVar4 = (uint)pNode1 ^ *(uint *)(uVar5 + 0x18);
  uVar3 = (uint)pNode2 ^ *(uint *)(uVar2 + 0x18);
  if (((uVar4 | uVar3) & 1) == 0) {
    if (0 < (long)p->nWordsRand) {
      lVar6 = 0;
      do {
        if ((*(uint *)(*(long *)(uVar2 + 0x68) + lVar6 * 4) |
            *(uint *)(*(long *)(uVar5 + 0x68) + lVar6 * 4)) != 0xffffffff) {
          return 0;
        }
        lVar6 = lVar6 + 1;
      } while (p->nWordsRand != lVar6);
    }
    if (0 < (long)p->iWordStart) {
      lVar6 = 0;
      do {
        if ((*(uint *)(*(long *)(uVar2 + 0x70) + lVar6 * 4) |
            *(uint *)(*(long *)(uVar5 + 0x70) + lVar6 * 4)) != 0xffffffff) {
          return 0;
        }
        lVar6 = lVar6 + 1;
      } while (p->iWordStart != lVar6);
    }
  }
  else {
    uVar3 = uVar3 & 1;
    if (((uVar4 & 1) == 0) || (uVar3 != 0)) {
      uVar1 = p->nWordsRand;
      if (((uVar4 & 1) == 0) && (uVar3 != 0)) {
        if (0 < (int)uVar1) {
          uVar7 = 0;
          do {
            if ((*(uint *)(*(long *)(uVar2 + 0x68) + uVar7 * 4) &
                ~*(uint *)(*(long *)(uVar5 + 0x68) + uVar7 * 4)) != 0) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        if (0 < (long)p->iWordStart) {
          lVar6 = 0;
          do {
            if ((*(uint *)(*(long *)(uVar2 + 0x70) + lVar6 * 4) &
                ~*(uint *)(*(long *)(uVar5 + 0x70) + lVar6 * 4)) != 0) {
              return 0;
            }
            lVar6 = lVar6 + 1;
          } while (p->iWordStart != lVar6);
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar7 = 0;
          do {
            if ((*(uint *)(*(long *)(uVar5 + 0x68) + uVar7 * 4) &
                *(uint *)(*(long *)(uVar2 + 0x68) + uVar7 * 4)) != 0) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        if (0 < (long)p->iWordStart) {
          lVar6 = 0;
          do {
            if ((*(uint *)(*(long *)(uVar5 + 0x70) + lVar6 * 4) &
                *(uint *)(*(long *)(uVar2 + 0x70) + lVar6 * 4)) != 0) {
              return 0;
            }
            lVar6 = lVar6 + 1;
          } while (p->iWordStart != lVar6);
        }
      }
    }
    else {
      if (0 < (long)p->nWordsRand) {
        lVar6 = 0;
        do {
          if ((*(uint *)(*(long *)(uVar5 + 0x68) + lVar6 * 4) &
              ~*(uint *)(*(long *)(uVar2 + 0x68) + lVar6 * 4)) != 0) {
            return 0;
          }
          lVar6 = lVar6 + 1;
        } while (p->nWordsRand != lVar6);
      }
      if (0 < (long)p->iWordStart) {
        lVar6 = 0;
        do {
          if ((*(uint *)(*(long *)(uVar5 + 0x70) + lVar6 * 4) &
              ~*(uint *)(*(long *)(uVar2 + 0x70) + lVar6 * 4)) != 0) {
            return 0;
          }
          lVar6 = lVar6 + 1;
        } while (p->iWordStart != lVar6);
      }
    }
  }
  return 1;
}

Assistant:

int Fraig_ManCheckClauseUsingSimInfo( Fraig_Man_t * p, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    int fCompl1, fCompl2, i;

    fCompl1 = 1 ^ Fraig_IsComplement(pNode1) ^ Fraig_Regular(pNode1)->fInv;
    fCompl2 = 1 ^ Fraig_IsComplement(pNode2) ^ Fraig_Regular(pNode2)->fInv;

    pNode1 = Fraig_Regular(pNode1);
    pNode2 = Fraig_Regular(pNode2);
    assert( pNode1 != pNode2 );
    
    // check the simulation info
    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( !fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( fCompl1 && !fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
//    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
}